

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall World::DisplayWorld(World *this)

{
  char __rhs;
  World *this_00;
  reference pvVar1;
  reference pvVar2;
  ostream *poVar3;
  int k;
  ulong __n;
  size_type __n_00;
  size_type __n_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  displayStack;
  string temp;
  Tiles local_8c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  for (__n_01 = 0; (long)__n_01 < (long)this->worldHeight; __n_01 = __n_01 + 1) {
    local_70._M_string_length = 0;
    *local_70._M_dataplus._M_p = '\0';
    for (__n_00 = 0; (long)__n_00 < (long)this->worldWidth; __n_00 = __n_00 + 1) {
      this_00 = (World *)std::
                         vector<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
                         ::at(&this->world,__n_01);
      pvVar1 = std::vector<Tiles,_std::allocator<Tiles>_>::at
                         ((vector<Tiles,_std::allocator<Tiles>_> *)this_00,__n_00);
      local_8c.data = pvVar1->data;
      __rhs = TileToCharacter(this_00,&local_8c);
      std::operator+(&local_50,&local_70,__rhs);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      Tiles::~Tiles(&local_8c);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_88,&local_70);
  }
  for (__n = 0; __n < (ulong)((long)local_88.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_88.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&local_88,__n);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pvVar2);
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void World::DisplayWorld()
{
	vector<string> displayStack;
	string temp;

	for (int i = 0; i < worldHeight; ++i)
	{
		temp.clear();
		for (int j = 0; j < worldWidth; ++j)
		{
			temp = temp + TileToCharacter(world.at(i).at(j));
		}
		displayStack.push_back(temp);
	}

	for (int k = 0; k < displayStack.size(); ++k)
	{
		cout << displayStack.at(k) << "\n";
	}

}